

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

uint64_t __thiscall
GmmLib::GmmResourceInfoCommon::GetFastClearWidth(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GMM_TEXTURE_CALC *pGVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SKU_FEATURE_TABLE *pSVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GMM_TEXTURE_CALC *pTextureCalc;
  uint32_t numSamples;
  uint64_t mipWidth;
  uint64_t width;
  uint32_t MipLevel_local;
  GmmResourceInfoCommon *this_local;
  
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x16])(this,(ulong)MipLevel);
  mipWidth = CONCAT44(extraout_var,iVar1);
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x40])();
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pGVar3 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var_00,iVar2));
  if (iVar1 == 1) {
    iVar1 = (*pGVar3->_vptr_GmmTextureCalc[0x1c])(pGVar3,&this->Surf,mipWidth);
    mipWidth = CONCAT44(extraout_var_01,iVar1);
  }
  else if ((iVar1 == 2) || (iVar1 == 4)) {
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar4 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_02,iVar1));
    if (((ulong)pSVar4->field_1 >> 0x22 & 1) == 0) {
      mipWidth = (mipWidth + 7) - (mipWidth + 7 & 7) >> 3;
    }
    else {
      mipWidth = (mipWidth + 0x3f) - (mipWidth + 0x3f & 0x3f) >> 6;
    }
  }
  else if (iVar1 == 8) {
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar4 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_03,iVar1));
    if (((ulong)pSVar4->field_1 >> 0x22 & 1) == 0) {
      mipWidth = (mipWidth + 1) - (mipWidth + 1 & 1) >> 1;
    }
    else {
      mipWidth = (mipWidth + 0xf) - (mipWidth + 0xf & 0xf) >> 4;
    }
  }
  else {
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar4 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_04,iVar1));
    if (((ulong)pSVar4->field_1 >> 0x22 & 1) != 0) {
      mipWidth = (mipWidth + 7) - (mipWidth + 7 & 7) >> 3;
    }
  }
  return mipWidth;
}

Assistant:

uint64_t GmmLib::GmmResourceInfoCommon::GetFastClearWidth(uint32_t MipLevel)
{
    uint64_t width      = 0;
    uint64_t mipWidth   = GetMipWidth(MipLevel);
    uint32_t numSamples = GetNumSamples();

    GMM_TEXTURE_CALC *pTextureCalc;
    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    if(numSamples == 1)
    {
        width = pTextureCalc->ScaleFCRectWidth(&Surf, mipWidth);
    }
    else if(numSamples == 2 || numSamples == 4)
    {
        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
        {
            width = GFX_ALIGN(mipWidth, 64) / 64;
        }
        else
        {
            width = GFX_ALIGN(mipWidth, 8) / 8;
        }
    }
    else if(numSamples == 8)
    {
        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
        {
            width = GFX_ALIGN(mipWidth, 16) / 16;
        }
        else
        {
            width = GFX_ALIGN(mipWidth, 2) / 2;
        }
    }
    else // numSamples == 16
    {
        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
        {
            width = GFX_ALIGN(mipWidth, 8) / 8;
        }
        else
        {
            width = mipWidth;
        }
    }

    return width;
}